

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lclin.h
# Opt level: O1

void __thiscall libDAI::LCLin::LCLin(LCLin *this,LCLin *x)

{
  pointer pcVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  size_t sVar5;
  size_t sVar6;
  double dVar7;
  CavityType CVar8;
  bool bVar9;
  undefined7 uVar10;
  
  DAIAlg<libDAI::FactorGraph>::DAIAlg(&this->super_DAIAlgFG,&x->super_DAIAlgFG);
  (this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm =
       (_func_int **)&PTR_clone_005e8620;
  CVar8.v = (x->Props).cavity.v;
  bVar9 = (x->Props).reinit;
  uVar10 = *(undefined7 *)&(x->Props).field_0x9;
  dVar2 = (x->Props).cortol;
  dVar3 = (x->Props).tol;
  dVar4 = (x->Props).tol;
  sVar5 = (x->Props).maxiter;
  sVar6 = (x->Props).verbose;
  dVar7 = (x->Props).damping;
  (this->Props).updates = (UpdateType)(x->Props).updates.v;
  (this->Props).cavity = (CavityType)CVar8.v;
  (this->Props).reinit = bVar9;
  *(undefined7 *)&(this->Props).field_0x9 = uVar10;
  (this->Props).cortol = dVar2;
  (this->Props).tol = dVar3;
  (this->Props).tol = dVar4;
  (this->Props).maxiter = sVar5;
  (this->Props).verbose = sVar6;
  (this->Props).damping = dVar7;
  (this->Props).cavainame._M_dataplus._M_p = (pointer)&(this->Props).cavainame.field_2;
  pcVar1 = (x->Props).cavainame._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->Props).cavainame,pcVar1,
             pcVar1 + (x->Props).cavainame._M_string_length);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
              *)&(this->Props).cavaiopts,
             (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
              *)&(x->Props).cavaiopts);
  this->_maxdiff = x->_maxdiff;
  this->_iterations = x->_iterations;
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            (&this->_phis,&x->_phis);
  std::
  vector<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>,_std::allocator<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>_>
  ::vector(&this->_gamma,&x->_gamma);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            (&this->_beliefs,&x->_beliefs);
  return;
}

Assistant:

LCLin( const LCLin & x ) : DAIAlgFG(x), Props(x.Props), _maxdiff(x._maxdiff), _iterations(x._iterations), _phis(x._phis), _gamma(x._gamma), _beliefs(x._beliefs) {}